

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu382.c
# Opt level: O1

MPP_RET hal_avs2d_vdpu382_start(void *hal,HalTaskInfo *task)

{
  Vdpu382Avs2dRegSet *__s;
  long lVar1;
  Vdpu382Avs2dRegSet *regs;
  MppDev ctx;
  MPP_RET MVar2;
  MPP_RET MVar3;
  undefined8 *puVar4;
  char *fmt;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  Vdpu382Avs2dRegSet *local_60;
  undefined8 local_58;
  Vdpu382Avs2dRegSet *local_50;
  long local_48;
  Vdpu382Avs2dRegSet *local_40;
  undefined8 local_38;
  
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","In.","hal_avs2d_vdpu382_start");
  }
  if (hal == (void *)0x0) {
    MVar2 = MPP_ERR_INIT;
    if (((byte)avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","input empty(%d).\n",(char *)0x0,0x36a);
    }
    goto LAB_001eb0d0;
  }
  if ((((ulong)(task->dec).flags & 0xc) != 0) && (*(int *)(*(long *)((long)hal + 8) + 0x30) == 0)) {
    MVar2 = MPP_NOK;
    goto LAB_001eb0d0;
  }
  lVar1 = *(long *)((long)hal + 0x5a8);
  if (*(int *)((long)hal + 0x5a0) == 0) {
    puVar4 = (undefined8 *)(lVar1 + 0x50);
  }
  else {
    puVar4 = (undefined8 *)((long)(task->dec).reg_index * 0x18 + 0x10 + lVar1);
  }
  regs = (Vdpu382Avs2dRegSet *)*puVar4;
  ctx = *(MppDev *)((long)hal + 0x40);
  *(int *)((long)hal + 0x5c0) = *(int *)((long)hal + 0x5c0) + 1;
  local_58 = 0x2000000070;
  local_60 = regs;
  MVar2 = mpp_dev_ioctl(ctx,4,&local_60);
  if (MVar2 == MPP_OK) {
    local_58 = 0x100000000c4;
    local_60 = (Vdpu382Avs2dRegSet *)&regs->avs2d_param;
    local_48 = lVar1;
    MVar2 = mpp_dev_ioctl(ctx,4,&local_60);
    if (MVar2 != MPP_OK) goto LAB_001eb09c;
    local_60 = (Vdpu382Avs2dRegSet *)&regs->common_addr;
    local_58 = 0x20000000040;
    local_50 = (Vdpu382Avs2dRegSet *)&regs->avs2d_param;
    MVar2 = mpp_dev_ioctl(ctx,4,&local_60);
    if (MVar2 != MPP_OK) goto LAB_001eb09c;
    local_60 = (Vdpu382Avs2dRegSet *)&regs->avs2d_addr;
    local_58 = 0x280000000a0;
    MVar2 = mpp_dev_ioctl(ctx,4,&local_60);
    if (MVar2 != MPP_OK) goto LAB_001eb09c;
    local_58 = 0x40000000058;
    local_60 = (Vdpu382Avs2dRegSet *)&regs->statistic;
    MVar2 = mpp_dev_ioctl(ctx,4,&local_60);
    if (MVar2 != MPP_OK) goto LAB_001eb09c;
    local_40 = (Vdpu382Avs2dRegSet *)&regs->irq_status;
    local_38 = 0x38000000038;
    MVar2 = mpp_dev_ioctl(ctx,5,&local_40);
    if (MVar2 == MPP_OK) {
      local_40 = local_50;
      local_38 = 0x100000000c4;
      MVar2 = mpp_dev_ioctl(ctx,5,&local_40);
      if (MVar2 == MPP_OK) {
        local_38 = 0x40000000058;
        local_40 = (Vdpu382Avs2dRegSet *)&regs->statistic;
        MVar2 = mpp_dev_ioctl(ctx,5,&local_40);
        lVar1 = local_48;
        if (MVar2 == MPP_OK) {
          if ((avs2d_hal_debug._1_1_ & 2) != 0) {
            __s = (Vdpu382Avs2dRegSet *)(local_48 + 0x284);
            memset(__s,0,0x458);
            local_38 = 0x458;
            local_40 = __s;
            mpp_dev_ioctl(ctx,5,&local_40);
          }
          vdpu382_set_rcbinfo(ctx,(Vdpu382RcbInfo *)(lVar1 + 0x20c));
          if ((avs2d_hal_debug._1_1_ & 4) != 0) {
            hal_avs2d_vdpu382_dump_stream(hal,task);
          }
          if ((avs2d_hal_debug._1_1_ & 2) != 0) {
            hal_avs2d_vdpu382_dump_reg_write(hal,regs);
          }
          MVar3 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
          MVar2 = MPP_OK;
          if (MVar3 != MPP_OK) {
            _mpp_log_l(2,"hal_avs2d_vdpu382","send cmd failed %d\n","hal_avs2d_vdpu382_start",
                       (ulong)(uint)MVar3);
            MVar2 = MVar3;
          }
          goto LAB_001eb0d0;
        }
        goto LAB_001eb09c;
      }
    }
    fmt = "set register read failed %d\n";
  }
  else {
LAB_001eb09c:
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_avs2d_vdpu382",fmt,"hal_avs2d_vdpu382_start",(ulong)(uint)MVar2);
LAB_001eb0d0:
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","Out.","hal_avs2d_vdpu382_start");
  }
  return MVar2;
}

Assistant:

MPP_RET hal_avs2d_vdpu382_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    Vdpu382Avs2dRegSet *regs = NULL;
    Avs2dVdpu382RegCtx_t *reg_ctx;
    MppDev dev = NULL;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    AVS2D_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == p_hal);

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->cfg->base.disable_error) {
        ret = MPP_NOK;
        goto __RETURN;
    }

    reg_ctx = (Avs2dVdpu382RegCtx_t *)p_hal->reg_ctx;
    regs = p_hal->fast_mode ? reg_ctx->reg_buf[task->dec.reg_index].regs : reg_ctx->regs;
    dev = p_hal->dev;

    p_hal->frame_no++;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->common;
        wr_cfg.size = sizeof(regs->common);
        wr_cfg.offset = OFFSET_COMMON_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->avs2d_param;
        wr_cfg.size = sizeof(regs->avs2d_param);
        wr_cfg.offset = OFFSET_CODEC_PARAMS_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->common_addr;
        wr_cfg.size = sizeof(regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->avs2d_addr;
        wr_cfg.size = sizeof(regs->avs2d_addr);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->statistic;
        wr_cfg.size = sizeof(regs->statistic);
        wr_cfg.offset = OFFSET_STATISTIC_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->irq_status;
        rd_cfg.size = sizeof(regs->irq_status);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->avs2d_param;
        rd_cfg.size = sizeof(regs->avs2d_param);
        rd_cfg.offset = OFFSET_CODEC_PARAMS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->statistic;
        rd_cfg.size = sizeof(regs->statistic);
        rd_cfg.offset = OFFSET_STATISTIC_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        if (avs2d_hal_debug & AVS2D_HAL_DBG_REG) {
            memset(reg_ctx->reg_out, 0, sizeof(reg_ctx->reg_out));
            rd_cfg.reg = reg_ctx->reg_out;
            rd_cfg.size = sizeof(reg_ctx->reg_out);
            rd_cfg.offset = 0;
            ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        }

        // rcb info for sram
        vdpu382_set_rcbinfo(dev, reg_ctx->rcb_info);

        if (avs2d_hal_debug & AVS2D_HAL_DBG_IN)
            hal_avs2d_vdpu382_dump_stream(hal, task);

        if (avs2d_hal_debug & AVS2D_HAL_DBG_REG)
            hal_avs2d_vdpu382_dump_reg_write(hal, regs);

        // send request to hardware
        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }

    } while (0);

__RETURN:
    AVS2D_HAL_TRACE("Out.");
    return ret;
}